

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

void cvui::render::trackbarSteps
               (cvui_block_t *theBlock,int theState,Rect *theShape,double theValue,
               TrackbarParams *theParams,Rect *theWorkingArea)

{
  int iVar1;
  longdouble theValue_00;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  longdouble local_88;
  longdouble local_7c;
  undefined4 local_70 [2];
  cvui_block_t *local_68;
  undefined8 local_60;
  Matx<double,_4,_1> local_58;
  
  iVar1 = theWorkingArea->height / 2 + theWorkingArea->y;
  cv::Matx<double,_4,_1>::Matx(&local_58);
  local_58.val[0] = 81.0;
  local_58.val[1] = 81.0;
  local_58.val[2] = 81.0;
  local_58.val[3] = 0.0;
  theValue_00 = *(longdouble *)theParams;
  if (((byte)theParams[0x34] & 4) == 0) {
    local_88 = (*(longdouble *)(theParams + 0x10) - theValue_00) / (longdouble)20.0;
  }
  else {
    local_88 = *(longdouble *)(theParams + 0x20);
  }
  while (theValue_00 <= *(longdouble *)(theParams + 0x10)) {
    local_7c = theValue_00;
    local_98 = internal::trackbarValueToXPixel(theParams,theShape,theValue_00);
    local_60 = 0;
    local_70[0] = 0x3010000;
    local_94 = iVar1 + -3;
    local_90 = local_98;
    local_8c = iVar1;
    local_68 = theBlock;
    cv::line(local_70,&local_90,&local_98,&local_58,1,8,
             (unkuint10)(uint6)((unkuint10)theValue_00 >> 0x20) << 0x20);
    theValue_00 = local_88 + local_7c;
  }
  return;
}

Assistant:

void trackbarSteps(cvui_block_t& theBlock, int theState, cv::Rect& theShape, double theValue, const internal::TrackbarParams &theParams, cv::Rect& theWorkingArea) {
		cv::Point aBarTopLeft(theWorkingArea.x, theWorkingArea.y + theWorkingArea.height / 2);
		cv::Scalar aColor(0x51, 0x51, 0x51);

		bool aDiscrete = internal::bitsetHas(theParams.options, cvui::TRACKBAR_DISCRETE);
		long double aFixedStep = aDiscrete ? theParams.step : (theParams.max - theParams.min) / 20;

		// TODO: check min, max and step to prevent infinite loop.
		for (long double aValue = theParams.min; aValue <= theParams.max; aValue += aFixedStep) {
			int aPixelX = internal::trackbarValueToXPixel(theParams, theShape, aValue);
			cv::Point aPoint1(aPixelX, aBarTopLeft.y);
			cv::Point aPoint2(aPixelX, aBarTopLeft.y - 3);
			cv::line(theBlock.where, aPoint1, aPoint2, aColor);
		}
	}